

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::RepeatedField
          (RepeatedField<unsigned_long> *this,RepeatedField<unsigned_long> *other)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  unsigned_long *puVar6;
  void **ppvVar7;
  LogMessage *other_00;
  LogFinisher local_49;
  LogMessage local_48;
  
  this->current_size_ = 0;
  this->total_size_ = 0;
  this->arena_or_elements_ = (void *)0x0;
  if (other->total_size_ == 0) {
    ppvVar7 = &other->arena_or_elements_;
  }
  else {
    puVar6 = elements(other);
    ppvVar7 = (void **)(puVar6 + -1);
  }
  if (*ppvVar7 == (void *)0x0) {
    if (this == other) {
      internal::LogMessage::LogMessage
                (&local_48,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x324);
      other_00 = internal::LogMessage::operator<<(&local_48,"CHECK failed: this != other: ");
      internal::LogFinisher::operator=(&local_49,other_00);
      internal::LogMessage::~LogMessage(&local_48);
    }
    iVar4 = this->current_size_;
    iVar5 = this->total_size_;
    pvVar1 = this->arena_or_elements_;
    iVar3 = other->total_size_;
    pvVar2 = other->arena_or_elements_;
    this->current_size_ = other->current_size_;
    this->total_size_ = iVar3;
    this->arena_or_elements_ = pvVar2;
    other->current_size_ = iVar4;
    other->total_size_ = iVar5;
    other->arena_or_elements_ = pvVar1;
  }
  else if (other != this) {
    this->current_size_ = 0;
    MergeFrom(this,other);
  }
  return;
}

Assistant:

inline RepeatedField<Element>::RepeatedField(RepeatedField&& other) noexcept
    : RepeatedField() {
#ifdef PROTOBUF_FORCE_COPY_IN_MOVE
  CopyFrom(other);
#else   // PROTOBUF_FORCE_COPY_IN_MOVE
  // We don't just call Swap(&other) here because it would perform 3 copies if
  // other is on an arena. This field can't be on an arena because arena
  // construction always uses the Arena* accepting constructor.
  if (other.GetArena()) {
    CopyFrom(other);
  } else {
    InternalSwap(&other);
  }
#endif  // !PROTOBUF_FORCE_COPY_IN_MOVE
}